

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O3

CreditCard * __thiscall CreditCard::operator=(CreditCard *this,CreditCard *copy)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  
  (this->super_Transaction).amount = (copy->super_Transaction).amount;
  iVar1 = (copy->super_Transaction).sender;
  iVar2 = (copy->super_Transaction).receiver;
  uVar3 = *(undefined4 *)&(copy->super_Transaction).field_0x14;
  (this->super_Transaction).id = (copy->super_Transaction).id;
  (this->super_Transaction).sender = iVar1;
  (this->super_Transaction).receiver = iVar2;
  *(undefined4 *)&(this->super_Transaction).field_0x14 = uVar3;
  std::__cxx11::string::_M_assign((string *)&this->cardNumber);
  std::__cxx11::string::_M_assign((string *)&this->expirationDate);
  std::__cxx11::string::_M_assign((string *)&this->cvv);
  return this;
}

Assistant:

CreditCard& CreditCard::operator=(const CreditCard &copy){
    Transaction::operator=(copy);
    cardNumber = copy.cardNumber;
    expirationDate = copy.expirationDate;
    cvv = copy.cvv;
    return *this;
}